

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 b;
  int iVar1;
  int *piVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi__uint32 sVar5;
  int iVar6;
  undefined8 in_RAX;
  char *pcVar7;
  stbi__uint16 *psVar8;
  uchar *puVar9;
  undefined4 in_register_00000084;
  int iVar10;
  long in_FS_OFFSET;
  char c;
  undefined8 uStack_38;
  
  piVar2 = (int *)CONCAT44(in_register_00000084,req_comp);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_38 = in_RAX;
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if ((byte)(sVar4 - 0x37) < 0xfe || sVar3 != 'P') {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    goto LAB_001342ac;
  }
  s->img_n = (uint)(sVar4 == '6') * 2 + 1;
  sVar3 = stbi__get8(s);
  uStack_38._0_4_ = CONCAT13(sVar3,(undefined3)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
  sVar5 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
  s->img_x = sVar5;
  if (sVar5 == 0) {
LAB_0013429c:
    pcVar7 = "invalid width";
  }
  else {
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
    sVar5 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
    s->img_y = sVar5;
    if (sVar5 == 0) goto LAB_0013429c;
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 3));
    iVar6 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 3));
    if (iVar6 < 0x10000) {
      *piVar2 = (uint)(0xff < iVar6) * 8 + 8;
      if ((s->img_y < 0x1000001) && (s->img_x < 0x1000001)) {
        *x = s->img_x;
        sVar5 = s->img_y;
        *y = sVar5;
        iVar6 = s->img_n;
        if (comp != (int *)0x0) {
          *comp = iVar6;
          sVar5 = s->img_y;
        }
        b = s->img_x;
        iVar1 = *piVar2;
        iVar10 = iVar1 + 7;
        if (-1 < iVar1) {
          iVar10 = iVar1;
        }
        iVar10 = iVar10 >> 3;
        uStack_38._4_4_ = iVar6;
        iVar6 = stbi__mad4sizes_valid(iVar6,b,sVar5,iVar10,req_comp);
        if (iVar6 != 0) {
          psVar8 = (stbi__uint16 *)stbi__malloc_mad4(uStack_38._4_4_,b,sVar5,iVar10,req_comp);
          if (psVar8 == (stbi__uint16 *)0x0) {
            pcVar7 = "outofmem";
          }
          else {
            iVar6 = stbi__getn(s,(stbi_uc *)psVar8,b * uStack_38._4_4_ * sVar5 * iVar10);
            if (iVar6 != 0) {
              iVar6 = s->img_n;
              if (iVar6 == 4) {
                return psVar8;
              }
              if (*piVar2 == 0x10) {
                psVar8 = stbi__convert_format16(psVar8,iVar6,s->img_x,s->img_y,req_comp);
                return psVar8;
              }
              puVar9 = stbi__convert_format((uchar *)psVar8,iVar6,s->img_x,s->img_y,req_comp);
              return puVar9;
            }
            free(psVar8);
            pcVar7 = "bad PNM";
          }
          goto LAB_001343a9;
        }
      }
      pcVar7 = "too large";
LAB_001343a9:
      *(char **)(in_FS_OFFSET + -8) = pcVar7;
      return (void *)0x0;
    }
    pcVar7 = "max value > 65535";
  }
  *(char **)(in_FS_OFFSET + -8) = pcVar7;
LAB_001342ac:
  *piVar2 = 0;
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   ri->bits_per_channel = stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n);
   if (ri->bits_per_channel == 0)
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad4sizes_valid(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad4(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (!stbi__getn(s, out, s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8))) {
      STBI_FREE(out);
      return stbi__errpuc("bad PNM", "PNM file truncated");
   }

   if (req_comp && req_comp != s->img_n) {
      if (ri->bits_per_channel == 16) {
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, s->img_n, req_comp, s->img_x, s->img_y);
      } else {
         out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      }
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}